

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O2

string * __thiscall
tinyusdz::print_shader_params_abi_cxx11_
          (string *__return_storage_ptr__,tinyusdz *this,UsdPrimvarReader_float2 *shader,
          uint32_t indent)

{
  string *psVar1;
  uint32_t indent_00;
  uint32_t in_R8D;
  stringstream ss;
  allocator local_201;
  string *local_200;
  string local_1f8;
  undefined1 local_1d8 [48];
  ostream local_1a8 [376];
  
  indent_00 = (uint32_t)shader;
  local_200 = __return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream((stringstream *)(local_1d8 + 0x20));
  ::std::__cxx11::string::string((string *)local_1d8,"inputs:varname",&local_201);
  print_str_attr(&local_1f8,
                 (TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(this + 0x998),(string *)local_1d8,indent_00);
  ::std::operator<<(local_1a8,(string *)&local_1f8);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)local_1d8,"inputs:fallback",&local_201);
  print_typed_attr<std::array<float,2ul>>
            (&local_1f8,this + 0x730,
             (TypedAttribute<tinyusdz::Animatable<std::array<float,_2UL>_>_> *)local_1d8,
             (string *)((ulong)shader & 0xffffffff),in_R8D);
  ::std::operator<<(local_1a8,(string *)&local_1f8);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)local_1d8,"outputs:result",&local_201);
  print_typed_terminal_attr<std::array<float,2ul>>
            (&local_1f8,this + 0xc18,(TypedTerminalAttribute<std::array<float,_2UL>_> *)local_1d8,
             (string *)((ulong)shader & 0xffffffff),in_R8D);
  ::std::operator<<(local_1a8,(string *)&local_1f8);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  print_common_shader_params_abi_cxx11_
            (&local_1f8,this,(ShaderNode *)((ulong)shader & 0xffffffff),indent_00);
  ::std::operator<<(local_1a8,(string *)&local_1f8);
  ::std::__cxx11::string::_M_dispose();
  psVar1 = local_200;
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream((stringstream *)(local_1d8 + 0x20));
  return psVar1;
}

Assistant:

static std::string print_shader_params(const UsdPrimvarReader_float2 &shader,
                                       const uint32_t indent) {
  std::stringstream ss;

  ss << print_str_attr(shader.varname, "inputs:varname", indent);
  ss << print_typed_attr(shader.fallback, "inputs:fallback", indent);
  ss << print_typed_terminal_attr(shader.result, "outputs:result", indent);

  ss << print_common_shader_params(shader, indent);

  return ss.str();
}